

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  int __fd;
  bool bVar1;
  ostream *poVar2;
  void *__buf;
  size_t sVar3;
  GTestLog local_2c;
  size_t local_28;
  size_t len;
  string *local_18;
  string *message_local;
  SocketWriter *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  bVar1 = IsTrue(this->sockfd_ != -1);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)((long)&len + 4),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest-internal-inl.h"
                       ,0x440);
    poVar2 = GTestLog::GetStream((GTestLog *)((long)&len + 4));
    poVar2 = std::operator<<(poVar2,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar2,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog((GTestLog *)((long)&len + 4));
  }
  local_28 = std::__cxx11::string::length();
  __fd = this->sockfd_;
  __buf = (void *)std::__cxx11::string::c_str();
  sVar3 = write(__fd,__buf,local_28);
  if (sVar3 != local_28) {
    GTestLog::GTestLog(&local_2c,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest-internal-inl.h"
                       ,0x445);
    poVar2 = GTestLog::GetStream(&local_2c);
    poVar2 = std::operator<<(poVar2,"stream_result_to: failed to stream to ");
    poVar2 = std::operator<<(poVar2,(string *)&this->host_name_);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&this->port_num_);
    GTestLog::~GTestLog(&local_2c);
  }
  return;
}

Assistant:

void Send(const std::string& message) override {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const auto len = static_cast<size_t>(message.length());
      if (write(sockfd_, message.c_str(), len) != static_cast<ssize_t>(len)) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }